

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cVertexAttribBindingTests.cpp
# Opt level: O0

long __thiscall gl4cts::anon_unknown_0::BasicInputLCase1::Run(BasicInputLCase1 *this)

{
  double *pdVar1;
  long lVar2;
  Vector<double,_4> local_178;
  Vector<double,_4> local_158;
  Vector<double,_4> local_138;
  Vector<double,_4> local_118;
  Vector<double,_4> local_f8;
  Vector<double,_4> local_d8;
  Vector<double,_4> local_b8;
  Vector<double,_4> local_98;
  Vector<double,_4> local_78;
  Vector<double,_4> local_58;
  Vector<double,_4> local_38;
  uint local_14;
  BasicInputLCase1 *pBStack_10;
  GLuint i;
  BasicInputLCase1 *this_local;
  
  pBStack_10 = this;
  for (local_14 = 0; local_14 < 8; local_14 = local_14 + 1) {
    glu::CallLogWrapper::glVertexAttribL4d
              (&(this->super_BasicInputLBase).super_VertexAttribBindingBase.super_SubcaseBase.
                super_GLWrapper.super_CallLogWrapper,local_14,0.0,0.0,0.0,0.0);
  }
  glu::CallLogWrapper::glBindBuffer
            (&(this->super_BasicInputLBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0x8892,this->m_vbo);
  glu::CallLogWrapper::glBufferData
            (&(this->super_BasicInputLBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0x8892,0x60,(void *)0x0,0x88e4);
  tcu::Vector<double,_4>::Vector(&local_38,1.0,2.0,3.0,4.0);
  pdVar1 = tcu::Vector<double,_4>::operator[](&local_38,0);
  glu::CallLogWrapper::glBufferSubData
            (&(this->super_BasicInputLBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0x8892,0,0x20,pdVar1);
  tcu::Vector<double,_4>::Vector(&local_58,5.0,6.0,7.0,8.0);
  pdVar1 = tcu::Vector<double,_4>::operator[](&local_58,0);
  glu::CallLogWrapper::glBufferSubData
            (&(this->super_BasicInputLBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0x8892,0x20,0x20,pdVar1);
  tcu::Vector<double,_4>::Vector(&local_78,9.0,10.0,11.0,12.0);
  pdVar1 = tcu::Vector<double,_4>::operator[](&local_78,0);
  glu::CallLogWrapper::glBufferSubData
            (&(this->super_BasicInputLBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0x8892,0x40,0x20,pdVar1);
  glu::CallLogWrapper::glBindBuffer
            (&(this->super_BasicInputLBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0x8892,0);
  glu::CallLogWrapper::glBindVertexArray
            (&(this->super_BasicInputLBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,this->m_vao);
  glu::CallLogWrapper::glVertexAttribLFormat
            (&(this->super_BasicInputLBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0,4,0x140a,0);
  glu::CallLogWrapper::glVertexAttribLFormat
            (&(this->super_BasicInputLBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,3,3,0x140a,8);
  glu::CallLogWrapper::glVertexAttribLFormat
            (&(this->super_BasicInputLBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,5,2,0x140a,0);
  glu::CallLogWrapper::glVertexAttribLFormat
            (&(this->super_BasicInputLBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,7,1,0x140a,0x18);
  glu::CallLogWrapper::glVertexAttribBinding
            (&(this->super_BasicInputLBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0,0);
  glu::CallLogWrapper::glVertexAttribBinding
            (&(this->super_BasicInputLBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,3,2);
  glu::CallLogWrapper::glVertexAttribBinding
            (&(this->super_BasicInputLBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,5,0);
  glu::CallLogWrapper::glVertexAttribBinding
            (&(this->super_BasicInputLBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,7,6);
  glu::CallLogWrapper::glEnableVertexAttribArray
            (&(this->super_BasicInputLBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0);
  glu::CallLogWrapper::glEnableVertexAttribArray
            (&(this->super_BasicInputLBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,3);
  glu::CallLogWrapper::glEnableVertexAttribArray
            (&(this->super_BasicInputLBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,5);
  glu::CallLogWrapper::glEnableVertexAttribArray
            (&(this->super_BasicInputLBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,7);
  glu::CallLogWrapper::glBindVertexBuffer
            (&(this->super_BasicInputLBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,0,this->m_vbo,0,0x20);
  glu::CallLogWrapper::glBindVertexBuffer
            (&(this->super_BasicInputLBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,2,this->m_vbo,0,0x10);
  glu::CallLogWrapper::glBindVertexBuffer
            (&(this->super_BasicInputLBase).super_VertexAttribBindingBase.super_SubcaseBase.
              super_GLWrapper.super_CallLogWrapper,6,this->m_vbo,0x10,0);
  tcu::Vector<double,_4>::Vector(&local_98,1.0,2.0,3.0,4.0);
  (this->super_BasicInputLBase).expected_data[0].m_data[0] = local_98.m_data[0];
  (this->super_BasicInputLBase).expected_data[0].m_data[1] = local_98.m_data[1];
  (this->super_BasicInputLBase).expected_data[0].m_data[2] = local_98.m_data[2];
  (this->super_BasicInputLBase).expected_data[0].m_data[3] = local_98.m_data[3];
  tcu::Vector<double,_4>::Vector(&local_b8,2.0,3.0,4.0,12345.0);
  (this->super_BasicInputLBase).expected_data[3].m_data[0] = local_b8.m_data[0];
  (this->super_BasicInputLBase).expected_data[3].m_data[1] = local_b8.m_data[1];
  (this->super_BasicInputLBase).expected_data[3].m_data[2] = local_b8.m_data[2];
  (this->super_BasicInputLBase).expected_data[3].m_data[3] = local_b8.m_data[3];
  tcu::Vector<double,_4>::Vector(&local_d8,1.0,2.0,12345.0,12345.0);
  (this->super_BasicInputLBase).expected_data[5].m_data[0] = local_d8.m_data[0];
  (this->super_BasicInputLBase).expected_data[5].m_data[1] = local_d8.m_data[1];
  (this->super_BasicInputLBase).expected_data[5].m_data[2] = local_d8.m_data[2];
  (this->super_BasicInputLBase).expected_data[5].m_data[3] = local_d8.m_data[3];
  tcu::Vector<double,_4>::Vector(&local_f8,6.0,12345.0,12345.0,12345.0);
  (this->super_BasicInputLBase).expected_data[7].m_data[0] = local_f8.m_data[0];
  (this->super_BasicInputLBase).expected_data[7].m_data[1] = local_f8.m_data[1];
  (this->super_BasicInputLBase).expected_data[7].m_data[2] = local_f8.m_data[2];
  (this->super_BasicInputLBase).expected_data[7].m_data[3] = local_f8.m_data[3];
  tcu::Vector<double,_4>::Vector(&local_118,5.0,6.0,7.0,8.0);
  (this->super_BasicInputLBase).expected_data[8].m_data[0] = local_118.m_data[0];
  (this->super_BasicInputLBase).expected_data[8].m_data[1] = local_118.m_data[1];
  (this->super_BasicInputLBase).expected_data[8].m_data[2] = local_118.m_data[2];
  (this->super_BasicInputLBase).expected_data[8].m_data[3] = local_118.m_data[3];
  tcu::Vector<double,_4>::Vector(&local_138,4.0,5.0,6.0,12345.0);
  (this->super_BasicInputLBase).expected_data[0xb].m_data[0] = local_138.m_data[0];
  (this->super_BasicInputLBase).expected_data[0xb].m_data[1] = local_138.m_data[1];
  (this->super_BasicInputLBase).expected_data[0xb].m_data[2] = local_138.m_data[2];
  (this->super_BasicInputLBase).expected_data[0xb].m_data[3] = local_138.m_data[3];
  tcu::Vector<double,_4>::Vector(&local_158,5.0,6.0,12345.0,12345.0);
  (this->super_BasicInputLBase).expected_data[0xd].m_data[0] = local_158.m_data[0];
  (this->super_BasicInputLBase).expected_data[0xd].m_data[1] = local_158.m_data[1];
  (this->super_BasicInputLBase).expected_data[0xd].m_data[2] = local_158.m_data[2];
  (this->super_BasicInputLBase).expected_data[0xd].m_data[3] = local_158.m_data[3];
  tcu::Vector<double,_4>::Vector(&local_178,6.0,12345.0,12345.0,12345.0);
  (this->super_BasicInputLBase).expected_data[0xf].m_data[0] = local_178.m_data[0];
  (this->super_BasicInputLBase).expected_data[0xf].m_data[1] = local_178.m_data[1];
  (this->super_BasicInputLBase).expected_data[0xf].m_data[2] = local_178.m_data[2];
  (this->super_BasicInputLBase).expected_data[0xf].m_data[3] = local_178.m_data[3];
  lVar2 = BasicInputLBase::Run(&this->super_BasicInputLBase);
  return lVar2;
}

Assistant:

virtual long Run()
	{
		for (GLuint i = 0; i < 8; ++i)
		{
			glVertexAttribL4d(i, 0.0, 0.0, 0.0, 0.0);
		}
		glBindBuffer(GL_ARRAY_BUFFER, m_vbo);
		glBufferData(GL_ARRAY_BUFFER, sizeof(DVec4) * 3, NULL, GL_STATIC_DRAW);
		glBufferSubData(GL_ARRAY_BUFFER, 0, sizeof(DVec4), &DVec4(1.0, 2.0, 3.0, 4.0)[0]);
		glBufferSubData(GL_ARRAY_BUFFER, 32, sizeof(DVec4), &DVec4(5.0, 6.0, 7.0, 8.0)[0]);
		glBufferSubData(GL_ARRAY_BUFFER, 64, sizeof(DVec4), &DVec4(9.0, 10.0, 11.0, 12.0)[0]);
		glBindBuffer(GL_ARRAY_BUFFER, 0);

		glBindVertexArray(m_vao);
		glVertexAttribLFormat(0, 4, GL_DOUBLE, 0);
		glVertexAttribLFormat(3, 3, GL_DOUBLE, 8);
		glVertexAttribLFormat(5, 2, GL_DOUBLE, 0);
		glVertexAttribLFormat(7, 1, GL_DOUBLE, 24);
		glVertexAttribBinding(0, 0);
		glVertexAttribBinding(3, 2);
		glVertexAttribBinding(5, 0);
		glVertexAttribBinding(7, 6);
		glEnableVertexAttribArray(0);
		glEnableVertexAttribArray(3);
		glEnableVertexAttribArray(5);
		glEnableVertexAttribArray(7);
		glBindVertexBuffer(0, m_vbo, 0, 32);
		glBindVertexBuffer(2, m_vbo, 0, 16);
		glBindVertexBuffer(6, m_vbo, 16, 0);

		expected_data[0]	 = DVec4(1.0, 2.0, 3.0, 4.0);
		expected_data[3]	 = DVec4(2.0, 3.0, 4.0, 12345.0);
		expected_data[5]	 = DVec4(1.0, 2.0, 12345.0, 12345.0);
		expected_data[7]	 = DVec4(6.0, 12345.0, 12345.0, 12345.0);
		expected_data[0 + 8] = DVec4(5.0, 6.0, 7.0, 8.0);
		expected_data[3 + 8] = DVec4(4.0, 5.0, 6.0, 12345.0);
		expected_data[5 + 8] = DVec4(5.0, 6.0, 12345.0, 12345.0);
		expected_data[7 + 8] = DVec4(6.0, 12345.0, 12345.0, 12345.0);
		return BasicInputLBase::Run();
	}